

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O0

void __thiscall wasm::PrintExpressionContents::visitBrOn(PrintExpressionContents *this,BrOn *curr)

{
  ostream *poVar1;
  bool bVar2;
  BasicType local_7c;
  string_view local_78;
  uintptr_t local_68;
  uintptr_t local_60;
  uintptr_t local_58;
  BasicType local_4c;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  BrOn *local_18;
  BrOn *curr_local;
  PrintExpressionContents *this_local;
  
  local_18 = curr;
  curr_local = (BrOn *)this;
  switch(curr->op) {
  case BrOnNull:
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_28,"br_on_null ");
    printMedium(poVar1,local_28);
    wasm::Name::print(&local_18->name,this->o);
    break;
  case BrOnNonNull:
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_38,"br_on_non_null ");
    printMedium(poVar1,local_38);
    wasm::Name::print(&local_18->name,this->o);
    break;
  case BrOnCast:
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,"br_on_cast ");
    printMedium(poVar1,local_48);
    wasm::Name::print(&local_18->name,this->o);
    std::operator<<(this->o,' ');
    local_4c = unreachable;
    bVar2 = wasm::Type::operator==(&local_18->ref->type,&local_4c);
    if (bVar2) {
      local_58 = (local_18->castType).id;
      printType(this,(Type)local_58);
    }
    else {
      local_60 = (local_18->ref->type).id;
      printType(this,(Type)local_60);
    }
    std::operator<<(this->o,' ');
    local_68 = (local_18->castType).id;
    printType(this,(Type)local_68);
    break;
  case BrOnCastFail:
    poVar1 = this->o;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_78,"br_on_cast_fail ");
    printMedium(poVar1,local_78);
    wasm::Name::print(&local_18->name,this->o);
    std::operator<<(this->o,' ');
    local_7c = unreachable;
    bVar2 = wasm::Type::operator==(&local_18->ref->type,&local_7c);
    if (bVar2) {
      printType(this,(Type)(local_18->castType).id);
    }
    else {
      printType(this,(Type)(local_18->ref->type).id);
    }
    std::operator<<(this->o,' ');
    printType(this,(Type)(local_18->castType).id);
    break;
  default:
    handle_unreachable("Unexpected br_on* op",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                       ,0x901);
  }
  return;
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
        printMedium(o, "br_on_null ");
        curr->name.print(o);
        return;
      case BrOnNonNull:
        printMedium(o, "br_on_non_null ");
        curr->name.print(o);
        return;
      case BrOnCast:
        printMedium(o, "br_on_cast ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          // Need to print some reference type in the correct hierarchy rather
          // than unreachable, and the cast type itself is the best possible
          // option.
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
      case BrOnCastFail:
        printMedium(o, "br_on_cast_fail ");
        curr->name.print(o);
        o << ' ';
        if (curr->ref->type == Type::unreachable) {
          printType(curr->castType);
        } else {
          printType(curr->ref->type);
        }
        o << ' ';
        printType(curr->castType);
        return;
    }
    WASM_UNREACHABLE("Unexpected br_on* op");
  }